

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.hpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::AMFImporter(AMFImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0080c538;
  this->mNodeElement_Cur = (CAMFImporter_NodeElement *)0x0;
  (this->mNodeElement_List).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mNodeElement_List;
  (this->mNodeElement_List).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->mNodeElement_List;
  (this->mNodeElement_List).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  this->mReader = (IrrXMLReader *)0x0;
  (this->mUnit)._M_dataplus._M_p = (pointer)&(this->mUnit).field_2;
  (this->mUnit)._M_string_length = 0;
  (this->mUnit).field_2._M_local_buf[0] = '\0';
  (this->mMaterial_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mMaterial_Converted;
  (this->mMaterial_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->mMaterial_Converted;
  (this->mMaterial_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ._M_impl._M_node._M_size = 0;
  (this->mTexture_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mTexture_Converted;
  (this->mTexture_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->mTexture_Converted;
  (this->mTexture_Converted).
  super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

AMFImporter() AI_NO_EXCEPT
    : mNodeElement_Cur(nullptr)
    , mReader(nullptr) {
        // empty
    }